

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

void copy_values_to_match_command(Am_Object *match_command,Am_Value *items_value)

{
  Am_Am_Slot_Key key;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value_00;
  Am_Am_Slot_Key local_9a;
  Am_Object start_object;
  Am_Object main_cmd;
  Am_Object script_group;
  Am_Object script_part;
  Am_Value_List slots_to_save;
  Am_Value value;
  Am_Value_List parts;
  Am_Value_List items;
  
  Am_Value_List::Am_Value_List(&items,items_value);
  pAVar2 = Am_Value_List::Get_First(&items);
  Am_Object::Am_Object(&script_group,pAVar2);
  pAVar2 = Am_Object::Get(&script_group,0xc5,0);
  Am_Object::Am_Object(&main_cmd,pAVar2);
  pAVar2 = Am_Object::Get(&main_cmd,0x11a,1);
  Am_Object::Am_Object(&start_object,pAVar2);
  pAVar2 = Am_Object::Get(&script_group,0x82,0);
  Am_Value_List::Am_Value_List(&parts,pAVar2);
  script_part.data = (Am_Object_Data *)0x0;
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Am_Value_List(&slots_to_save);
  Am_Value_List::Start(&parts);
  while( true ) {
    bVar1 = Am_Value_List::Last(&parts);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&parts);
    Am_Object::operator=(&script_part,pAVar2);
    pAVar2 = Am_Object::Get(&script_part,0xb8,3);
    Am_Am_Slot_Key::Am_Am_Slot_Key(&local_9a,pAVar2);
    key.value = local_9a.value;
    if (local_9a.value != 0) {
      Am_Value_List::Add(&slots_to_save,(uint)local_9a.value,Am_TAIL,true);
      pAVar2 = Am_Object::Get(&main_cmd,key.value,1);
      Am_Value::operator=(&value,pAVar2);
      bVar1 = Am_Value::Valid(&value);
      if (!bVar1) {
        bVar1 = Am_Object::Valid(&start_object);
        if (bVar1) {
          pAVar2 = Am_Object::Get(&start_object,key.value,1);
          Am_Value::operator=(&value,pAVar2);
        }
      }
      bVar1 = Am_Value::Valid(&value);
      if (bVar1) {
        Am_Object::Set(match_command,key.value,&value,1);
      }
    }
    Am_Value_List::Next(&parts);
  }
  value_00 = Am_Value_List::operator_cast_to_Am_Wrapper_(&slots_to_save);
  Am_Object::Set(match_command,0xb8,value_00,0);
  Am_Value_List::~Am_Value_List(&slots_to_save);
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&script_part);
  Am_Value_List::~Am_Value_List(&parts);
  Am_Object::~Am_Object(&start_object);
  Am_Object::~Am_Object(&main_cmd);
  Am_Object::~Am_Object(&script_group);
  Am_Value_List::~Am_Value_List(&items);
  return;
}

Assistant:

void
copy_values_to_match_command(Am_Object &match_command,
                             const Am_Value &items_value)
{
  Am_Value_List items = items_value;
  Am_Object script_group = items.Get_First();
  Am_Object main_cmd = script_group.Get(Am_COMMAND);
  //only used in create cmds
  Am_Object start_object = main_cmd.Peek(Am_START_OBJECT);
  Am_Value_List parts = script_group.Get(Am_GRAPHICAL_PARTS);
  Am_Am_Slot_Key slot;
  Am_Object script_part;
  Am_Value value;
  Am_Value_List slots_to_save;
  for (parts.Start(); !parts.Last(); parts.Next()) {
    script_part = parts.Get();
    slot = Am_Am_Slot_Key(
        script_part.Get(Am_SLOTS_TO_SAVE, Am_RETURN_ZERO_ON_ERROR));
    if ((int)slot != 0) {
      slots_to_save.Add(static_cast<int>(slot));
      value = main_cmd.Peek(slot);
      if (!value.Valid()) {
        if (start_object.Valid())
          value = start_object.Peek(slot);
      }
      if (value.Valid())
        match_command.Set(slot, value, Am_OK_IF_NOT_THERE);
    }
  }
  match_command.Set(Am_SLOTS_TO_SAVE, slots_to_save);
}